

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_offsetsurface.cpp
# Opt level: O1

void __thiscall ON_OffsetSurface::~ON_OffsetSurface(ON_OffsetSurface *this)

{
  ON_OffsetSurface *pOVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  
  (this->super_ON_SurfaceProxy).super_ON_Surface.super_ON_Geometry.super_ON_Object._vptr_ON_Object =
       (_func_int **)&PTR_ClassId_00825ed0;
  (this->m_offset_function).m_srf = (ON_Surface *)0x0;
  (this->m_offset_function).m_bZeroSideDerivative[0] = false;
  (this->m_offset_function).m_bZeroSideDerivative[1] = false;
  (this->m_offset_function).m_bZeroSideDerivative[2] = false;
  (this->m_offset_function).m_bZeroSideDerivative[3] = false;
  uVar2 = CONCAT44(ON_Interval::EmptyInterval.m_t[1]._4_4_,ON_Interval::EmptyInterval.m_t[1]._0_4_);
  *(ulong *)&(this->m_offset_function).field_0x8 =
       CONCAT44(ON_Interval::EmptyInterval.m_t[0]._4_4_,ON_Interval::EmptyInterval.m_t[0]._0_4_);
  *(undefined8 *)&(this->m_offset_function).field_0x10 = uVar2;
  uVar5 = ON_Interval::EmptyInterval.m_t[1]._4_4_;
  uVar4 = ON_Interval::EmptyInterval.m_t[1]._0_4_;
  uVar3 = ON_Interval::EmptyInterval.m_t[0]._4_4_;
  *(undefined4 *)&(this->m_offset_function).field_0x18 = ON_Interval::EmptyInterval.m_t[0]._0_4_;
  *(undefined4 *)&(this->m_offset_function).field_0x1c = uVar3;
  *(undefined4 *)&(this->m_offset_function).field_0x20 = uVar4;
  *(undefined4 *)&(this->m_offset_function).field_0x24 = uVar5;
  if (-1 < (this->m_offset_function).m_bumps.m_capacity) {
    (this->m_offset_function).m_bumps.m_count = 0;
  }
  (this->m_offset_function).m_bValid = false;
  (this->m_offset_function).m_srf = (ON_Surface *)0x0;
  pOVar1 = (ON_OffsetSurface *)this->m__pSrf;
  if (pOVar1 != this && pOVar1 != (ON_OffsetSurface *)0x0) {
    (*(pOVar1->super_ON_SurfaceProxy).super_ON_Surface.super_ON_Geometry.super_ON_Object.
      _vptr_ON_Object[4])();
  }
  this->m__pSrf = (ON_Surface *)0x0;
  ON_OffsetSurfaceFunction::~ON_OffsetSurfaceFunction(&this->m_offset_function);
  ON_SurfaceProxy::~ON_SurfaceProxy(&this->super_ON_SurfaceProxy);
  return;
}

Assistant:

ON_OffsetSurface::~ON_OffsetSurface()
{
  m_offset_function.SetBaseSurface( 0 );
  if ( 0 != m__pSrf && this != m__pSrf )
    delete m__pSrf;
  m__pSrf = 0;
  
}